

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PostScript.cxx
# Opt level: O3

void __thiscall Fl_PostScript_File_Device::origin(Fl_PostScript_File_Device *this,int x,int y)

{
  Fl_PostScript_Graphics_Driver *this_00;
  
  (this->super_Fl_Paged_Device).x_offset = x;
  (this->super_Fl_Paged_Device).y_offset = y;
  this_00 = (Fl_PostScript_Graphics_Driver *)
            (this->super_Fl_Paged_Device).super_Fl_Surface_Device._driver;
  Fl_PostScript_Graphics_Driver::clocale_printf
            (this_00,"GR GR GS %d %d TR  %f %f SC %d %d TR %f rotate GS\n",(double)this_00->scale_x,
             (double)this_00->scale_y,(double)this_00->angle,(ulong)(uint)this_00->left_margin,
             (ulong)(uint)this_00->top_margin,(ulong)(uint)x,(ulong)(uint)y);
  return;
}

Assistant:

void Fl_PostScript_File_Device::origin(int x, int y)
{
  x_offset = x;
  y_offset = y;
  Fl_PostScript_Graphics_Driver *ps = driver();
  ps->clocale_printf("GR GR GS %d %d TR  %f %f SC %d %d TR %f rotate GS\n",
	  ps->left_margin, ps->top_margin, ps->scale_x, ps->scale_y, x, y, ps->angle);
}